

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Sector_SetFade(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                     int arg4)

{
  int iVar1;
  int secnum;
  FSectorTagIterator itr;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  itr.searchtag = arg2;
  itr.start = arg1;
  FSectorTagIterator::FSectorTagIterator((FSectorTagIterator *)&stack0xffffffffffffffd0,arg0);
  while( true ) {
    iVar1 = FSectorTagIterator::Next((FSectorTagIterator *)&stack0xffffffffffffffd0);
    if (iVar1 < 0) break;
    sector_t::SetFade(sectors + iVar1,itr.start,itr.searchtag,arg3);
  }
  return 1;
}

Assistant:

FUNC(LS_Sector_SetFade)
// Sector_SetFade (tag, r, g, b)
{
	FSectorTagIterator itr(arg0);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
	{
		sectors[secnum].SetFade(arg1, arg2, arg3);
	}
	return true;
}